

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islower.c
# Opt level: O3

int main(void)

{
  _PDCLIB_lc_ctype_entry_t *p_Var1;
  
  p_Var1 = _PDCLIB_lc_ctype->entry;
  if ((p_Var1[0x61].flags & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1a,"islower( \'a\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x7a].flags & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1b,"islower( \'z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x41].flags & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1c,"! islower( \'A\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x5a].flags & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1d,"! islower( \'Z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x20].flags & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1e,"! islower( \' \' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x40].flags & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1f,"! islower( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( islower( 'a' ) );
    TESTCASE( islower( 'z' ) );
    TESTCASE( ! islower( 'A' ) );
    TESTCASE( ! islower( 'Z' ) );
    TESTCASE( ! islower( ' ' ) );
    TESTCASE( ! islower( '@' ) );
    return TEST_RESULTS;
}